

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O2

void emit_asm(BuildCtx *ctx)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  BuildMode BVar4;
  BuildSym *pBVar5;
  ulong uVar6;
  uint n;
  uint n_00;
  long lVar7;
  uint8_t *p;
  char *__format;
  FILE *__stream;
  long lVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  int *piVar12;
  
  fprintf((FILE *)ctx->fp,"\t.file \"buildvm_%s.dasc\"\n",ctx->dasm_arch);
  fwrite("\t.text\n",7,1,(FILE *)ctx->fp);
  if ((ulong)ctx->mode < 3) {
    fprintf((FILE *)ctx->fp,&DAT_00111abc + *(int *)(&DAT_00111abc + (ulong)ctx->mode * 4),4);
  }
  emit_asm_label(ctx,ctx->beginsym,0,0);
  if (ctx->mode != BUILD_machasm) {
    fwrite(".Lbegin:\n",9,1,(FILE *)ctx->fp);
  }
  lVar8 = 0;
  lVar7 = 0;
  while (lVar7 < ctx->nsym) {
    pBVar5 = ctx->sym;
    iVar9 = pBVar5[lVar7].ofs;
    iVar2 = pBVar5[lVar7 + 1].ofs;
    emit_asm_label(ctx,pBVar5[lVar7].name,iVar2 - iVar9,1);
    lVar8 = (long)(int)lVar8;
    for (piVar12 = &ctx->reloc[lVar8].type;
        (lVar8 < ctx->nreloc && (iVar3 = ((BuildReloc *)(piVar12 + -2))->ofs, iVar3 <= iVar2));
        piVar12 = piVar12 + 3) {
      n = iVar3 - iVar9;
      if ((*piVar12 == 0) || ((ctx->mode & ~BUILD_machasm) != BUILD_elfasm)) {
        emit_asm_bytes(ctx,ctx->code + iVar9,n);
        iVar9 = *piVar12;
        pcVar11 = ctx->relocsym[piVar12[-1]];
        if (ctx->mode == BUILD_coffasm) {
          fprintf((FILE *)ctx->fp,"\t.def %s; .scl 3; .type 32; .endef\n",pcVar11);
LAB_0010903d:
          __stream = (FILE *)ctx->fp;
          if (iVar9 == 0) goto LAB_0010904f;
          pcVar10 = "\t.long %s-.-4\n";
        }
        else {
          if (ctx->mode == BUILD_elfasm) goto LAB_0010903d;
          __stream = (FILE *)ctx->fp;
LAB_0010904f:
          pcVar10 = "\t.long %s\n";
        }
        fprintf(__stream,pcVar10,pcVar11);
      }
      else {
        pcVar11 = ctx->relocsym[piVar12[-1]];
        if ((int)n < 1) {
LAB_00109199:
          fprintf(_stderr,"Error: unsupported opcode for %s symbol relocation.\n",pcVar11);
          exit(1);
        }
        p = ctx->code + iVar9;
        n_00 = n - 1;
        bVar1 = p[n_00];
        if (bVar1 == 0xe8) {
          pcVar10 = "call";
        }
        else if (bVar1 == 0xe9) {
          pcVar10 = "jmp";
        }
        else {
          if ((((-1 < (char)bVar1) || (n == 1)) || (0x8f < bVar1)) || (p[(ulong)n - 2] != '\x0f'))
          goto LAB_00109199;
          pcVar10 = jccnames_rel + *(int *)(jccnames_rel + (ulong)(bVar1 & 0x7f) * 4);
          n_00 = n - 2;
        }
        emit_asm_bytes(ctx,p,n_00);
        uVar6 = (ulong)(*pcVar11 == '_');
        if ((((pcVar11[uVar6] == 'l') && (pcVar11[uVar6 + 1] == 'j')) && (pcVar11[uVar6 + 2] == '_')
            ) || (__format = "\t%s %s@PLT\n", ctx->mode != BUILD_elfasm)) {
          __format = "\t%s %s\n";
        }
        fprintf((FILE *)ctx->fp,__format,pcVar10,pcVar11);
      }
      iVar9 = iVar3 + 4;
      lVar8 = lVar8 + 1;
    }
    emit_asm_bytes(ctx,ctx->code + iVar9,iVar2 - iVar9);
    lVar7 = lVar7 + 1;
  }
  fputc(10,(FILE *)ctx->fp);
  BVar4 = ctx->mode;
  if (BVar4 == BUILD_machasm) {
    pcVar11 = "\t.cstring\n\t.ascii \"%s\\0\"\n";
  }
  else {
    pcVar11 = "\t.ident \"%s\"\n";
    if (BVar4 != BUILD_coffasm) {
      if (BVar4 != BUILD_elfasm) goto LAB_0010917f;
      fwrite("\t.section .note.GNU-stack,\"\",@progbits\n",0x27,1,(FILE *)ctx->fp);
    }
  }
  fprintf((FILE *)ctx->fp,pcVar11,ctx->dasm_ident);
LAB_0010917f:
  fputc(10,(FILE *)ctx->fp);
  return;
}

Assistant:

void emit_asm(BuildCtx *ctx)
{
  int i, rel;

  fprintf(ctx->fp, "\t.file \"buildvm_%s.dasc\"\n", ctx->dasm_arch);
  fprintf(ctx->fp, "\t.text\n");
#if LJ_TARGET_MIPS32 && !LJ_ABI_SOFTFP
  fprintf(ctx->fp, "\t.module fp=32\n");
#endif
#if LJ_TARGET_MIPS
  fprintf(ctx->fp, "\t.set nomips16\n\t.abicalls\n\t.set noreorder\n\t.set nomacro\n");
#endif
  emit_asm_align(ctx, 4);

#if LJ_TARGET_PS3
  emit_asm_label(ctx, ctx->beginsym, ctx->codesz, 0);
#else
  emit_asm_label(ctx, ctx->beginsym, 0, 0);
#endif
  if (ctx->mode != BUILD_machasm)
    fprintf(ctx->fp, ".Lbegin:\n");

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  /* This should really be moved into buildvm_arm.dasc. */
#if LJ_ARCH_HASFPU
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".vsave {d8-d15}\n"
	  ".save {r4}\n"
	  ".pad #28\n");
#else
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r4, r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".pad #28\n");
#endif
#endif

  for (i = rel = 0; i < ctx->nsym; i++) {
    int32_t ofs = ctx->sym[i].ofs;
    int32_t next = ctx->sym[i+1].ofs;
#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND && LJ_HASFFI
    if (!strcmp(ctx->sym[i].name, "lj_vm_ffi_call"))
      fprintf(ctx->fp,
	      ".globl lj_err_unwind_arm\n"
	      ".personality lj_err_unwind_arm\n"
	      ".fnend\n"
	      ".fnstart\n"
	      ".save {r4, r5, r11, lr}\n"
	      ".setfp r11, sp\n");
#endif
    emit_asm_label(ctx, ctx->sym[i].name, next - ofs, 1);
    while (rel < ctx->nreloc && ctx->reloc[rel].ofs <= next) {
      BuildReloc *r = &ctx->reloc[rel];
      int n = r->ofs - ofs;
#if LJ_TARGET_X86ORX64
      if (r->type != 0 &&
	  (ctx->mode == BUILD_elfasm || ctx->mode == BUILD_machasm)) {
	emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      } else {
	emit_asm_bytes(ctx, ctx->code+ofs, n);
	emit_asm_reloc(ctx, r->type, ctx->relocsym[r->sym]);
      }
      ofs += n+4;
#else
      emit_asm_wordreloc(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n;
#endif
      rel++;
    }
#if LJ_TARGET_X86ORX64
    emit_asm_bytes(ctx, ctx->code+ofs, next-ofs);
#else
    emit_asm_words(ctx, ctx->code+ofs, next-ofs);
#endif
  }

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  fprintf(ctx->fp,
#if !LJ_HASFFI
	  ".globl lj_err_unwind_arm\n"
	  ".personality lj_err_unwind_arm\n"
#endif
	  ".fnend\n");
#endif

  fprintf(ctx->fp, "\n");
  switch (ctx->mode) {
  case BUILD_elfasm:
#if !(LJ_TARGET_PS3 || LJ_TARGET_PSVITA)
    fprintf(ctx->fp, "\t.section .note.GNU-stack,\"\"," ELFASM_PX "progbits\n");
#endif
#if LJ_TARGET_PPC && !LJ_TARGET_PS3 && !LJ_ABI_SOFTFP
    /* Hard-float ABI. */
    fprintf(ctx->fp, "\t.gnu_attribute 4, 1\n");
#endif
    /* fallthrough */
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.ident \"%s\"\n", ctx->dasm_ident);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\t.cstring\n"
      "\t.ascii \"%s\\0\"\n", ctx->dasm_ident);
    break;
  default:
    break;
  }
  fprintf(ctx->fp, "\n");
}